

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O2

void njoy::ENDFtk::record::Zipper::
     process<njoy::ENDFtk::record::Zipper::Zipped<njoy::ENDFtk::record::Real,njoy::ENDFtk::record::Integer<11>>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,double,long,double,long,double,long>
               (ReadingPack<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                pack,double *references,long *references_1,double *references_2,long *references_3,
               double *references_4,long *references_5)

{
  tools::disco::
  Record<njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::ENDF,njoy::tools::disco::Integer<11u>,njoy::tools::disco::Column<0u>,njoy::tools::disco::RetainCarriage>
  ::
  read<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,double,long,double,long,double,long>
            (pack.it,pack.end,references,references_1,references_2,references_3,references_4,
             references_5);
  verifyTail<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            (pack.it,pack.end,pack.lineNumber,pack.MAT,pack.MF,pack.MT);
  return;
}

Assistant:

static void
process( ReadingPack< Iterator > pack, References&... references ){
  Zip::Format::read( pack.it, pack.end, references... );
  verifyTail( pack.it, pack.end, pack.lineNumber,
              pack.MAT, pack.MF, pack.MT );
}